

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
          (cmNinjaNormalTargetGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer this_01;
  unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> *this_02;
  unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> local_70;
  string local_68;
  reference local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmGeneratorTarget *target_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  cmNinjaTargetGenerator::cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator,target);
  (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_01106668;
  std::__cxx11::string::string((string *)&this->DeviceLinkObject);
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != OBJECT_LIBRARY) {
    this_00 = cmCommonTargetGenerator::GetConfigNames_abi_cxx11_((cmCommonTargetGenerator *)this);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&config), bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      cmGeneratorTarget::GetDirectory(&local_68,target,local_48,RuntimeBinaryArtifact);
      cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::make_unique<cmOSXBundleGenerator,cmGeneratorTarget*&>((cmGeneratorTarget **)&local_70);
  this_02 = &(this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
  std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::operator=
            (this_02,&local_70);
  std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::~unique_ptr
            (&local_70);
  this_01 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
            operator->(this_02);
  cmOSXBundleGenerator::SetMacContentFolders
            (this_01,&(this->super_cmNinjaTargetGenerator).MacContentFolders);
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(
  cmGeneratorTarget* target)
  : cmNinjaTargetGenerator(target)
{
  if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    // on Windows the output dir is already needed at compile time
    // ensure the directory exists (OutDir test)
    for (auto const& config : this->GetConfigNames()) {
      this->EnsureDirectoryExists(target->GetDirectory(config));
    }
  }

  this->OSXBundleGenerator = cm::make_unique<cmOSXBundleGenerator>(target);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}